

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

string * __thiscall
MPL::detail::ModelPackageImpl::addItem
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  runtime_error *this_00;
  ModelPackageImpl *pMVar1;
  path local_b0;
  string *local_88;
  path filePath;
  path dstPath;
  
  pMVar1 = this;
  local_88 = description;
  findItem((ModelPackageImpl *)&filePath,(string *)this,name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filePath._M_pathname._M_string_length);
  if (filePath._M_pathname._M_dataplus._M_p == (pointer)0x0) {
    getItemPath(&filePath,pMVar1,name,author);
    std::filesystem::__cxx11::operator/(&dstPath,&this->m_packageDataDirPath,&filePath);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_b0);
    std::filesystem::__cxx11::path::~path(&local_b0);
    pMVar1 = (ModelPackageImpl *)&dstPath;
    std::filesystem::copy((EVP_PKEY_CTX *)path,(EVP_PKEY_CTX *)pMVar1);
    generateIdentifier_abi_cxx11_(__return_storage_ptr__,pMVar1);
    std::filesystem::__cxx11::path::string(&local_b0._M_pathname,&filePath);
    createItemInfoEntry(this,__return_storage_ptr__,&local_b0._M_pathname,name,author,local_88);
    std::__cxx11::string::~string((string *)&local_b0);
    std::filesystem::__cxx11::path::~path(&dstPath);
    std::filesystem::__cxx11::path::~path(&filePath);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0._M_pathname,"The package already contains a file with name: ",name);
  std::operator+(&dstPath._M_pathname,&local_b0._M_pathname," author: ");
  std::operator+(&filePath._M_pathname,&dstPath._M_pathname,author);
  std::runtime_error::runtime_error(this_00,(string *)&filePath);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string ModelPackageImpl::addItem(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
    std::filesystem::copy(path, dstPath);
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return identifier;
}